

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libwatson.c
# Opt level: O0

int watson_write_from_file_to_file(IOFormat input,IOFormat output,FILE *source,FILE *dest)

{
  Data data;
  int k;
  Data d;
  FILE *dest_local;
  FILE *source_local;
  IOFormat output_local;
  IOFormat input_local;
  
  if ((source == (FILE *)0x0) || (dest == (FILE *)0x0)) {
    output_local = ~Watson;
  }
  else {
    data = (*decodeMap[input].parseStream)(source);
    if (data == (Data)0x0) {
      output_local = ~Json;
    }
    else {
      output_local = (*decodeMap[output].writeToStream)(data,dest);
      deepFreeData(data);
    }
  }
  return output_local;
}

Assistant:

int watson_write_from_file_to_file(IOFormat input, IOFormat output, FILE *source, FILE *dest) {
    if (source == NULL || dest == NULL)return LIB_WATSON_INVALID_PARAMS;
    Data d = decodeMap[input].parseStream(source);
    if (d == NULL)return LIB_WATSON_PARSE_ERROR;
    int k = decodeMap[output].writeToStream(d, dest);
    deepFreeData(d);
    return k;
}